

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O1

void __thiscall TLeonardoHeap<double>::insertion_sort(TLeonardoHeap<double> *this,size_t element)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  double tmp;
  
  uVar8 = this->tree_vector;
  if ((~(uint)uVar8 & 3) == 0) {
    this->tree_vector = uVar8 >> 2 | 1;
    this->first_tree = this->first_tree + 2;
  }
  else if (this->first_tree == 1) {
    this->tree_vector = uVar8 * 2 + 1;
    this->first_tree = 0;
  }
  else {
    this->tree_vector = uVar8 << ((char)this->first_tree - 1U & 0x3f) | 1;
    this->first_tree = 1;
  }
  uVar7 = (ulong)this->first_tree;
  uVar8 = Leonardo_k[uVar7];
  if (uVar8 <= element) {
    pdVar4 = this->data;
    uVar5 = this->N;
    uVar1 = uVar5 + 1;
    uVar6 = this->tree_vector;
    uVar12 = 2;
    do {
      uVar9 = element - uVar8;
      dVar2 = pdVar4[uVar9];
      dVar3 = pdVar4[element];
      if ((dVar2 <= dVar3) ||
         ((1 < uVar7 &&
          ((dVar2 < pdVar4[element - 1] || dVar2 == pdVar4[element - 1] ||
           (dVar2 < pdVar4[(element - 1) -
                           *(long *)("basic_string::_M_construct null not valid" + uVar7 * 8 + 0x23)
                          ] ||
            dVar2 == pdVar4[(element - 1) -
                            *(long *)("basic_string::_M_construct null not valid" + uVar7 * 8 + 0x23
                                     )])))))) break;
      pdVar4[element] = dVar2;
      pdVar4[uVar9] = dVar3;
      uVar7 = uVar7 + 1;
      uVar8 = uVar7;
      uVar13 = uVar12;
      if (uVar7 < uVar1) {
        do {
          uVar12 = uVar13 * 2;
          uVar7 = uVar8;
          if ((uVar13 & uVar6) != 0) break;
          bVar14 = uVar8 != uVar5;
          uVar7 = uVar1;
          uVar8 = uVar8 + 1;
          uVar13 = uVar12;
        } while (bVar14);
      }
      uVar8 = Leonardo_k[uVar7];
      element = uVar9;
    } while (uVar8 <= uVar9);
  }
  if (1 < uVar7) {
    pdVar4 = this->data;
    do {
      sVar11 = (element - 1) -
               *(long *)("basic_string::_M_construct null not valid" + uVar7 * 8 + 0x23);
      sVar10 = element - 1;
      if (pdVar4[element - 1] <= pdVar4[sVar11]) {
        sVar10 = sVar11;
      }
      dVar2 = pdVar4[element];
      if (pdVar4[sVar10] <= dVar2) {
        return;
      }
      if (pdVar4[sVar11] < pdVar4[element - 1]) {
        uVar7 = uVar7 - 2;
      }
      else {
        uVar7 = uVar7 - 1;
      }
      pdVar4[element] = pdVar4[sVar10];
      pdVar4[sVar10] = dVar2;
      element = sVar10;
    } while (1 < uVar7);
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::insertion_sort(size_t element) {
	if((tree_vector & 1) && (tree_vector & 2)) {	// Smallest two trees are of sequential order
		// Insert a tree of order L_{k+2} with the new element as the root
		tree_vector = (tree_vector >> 2) | 1;
		first_tree += 2;
	} else if(first_tree == 1) {
		// Insert a singleton node of order L_0
		tree_vector = (tree_vector << 1) | 1;
		first_tree = 0;
	} else {
		// Insert a singleton node of order L_1
		tree_vector = (tree_vector << (first_tree-1)) | 1;
		first_tree = 1;
	}
	// Filter leftwards to restore ascending root and max-heap properties
	filter(element, first_tree);
}